

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O1

void chaiscript::bootstrap::standard_library::
     input_range_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
               (string *type,Module *m)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  detail::
  input_range_type_impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (type,m);
  std::operator+(&local_38,"Const_",type);
  detail::
  input_range_type_impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (&local_38,m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void input_range_type(const std::string &type, Module &m) {
    detail::input_range_type_impl<Bidir_Range<ContainerType, typename ContainerType::iterator>>(type, m);
    detail::input_range_type_impl<Bidir_Range<const ContainerType, typename ContainerType::const_iterator>>("Const_" + type, m);
  }